

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Help_View.cxx
# Opt level: O0

char * __thiscall Fl_Help_View::get_attr(Fl_Help_View *this,char *p,char *n,char *buf,int bufsize)

{
  char cVar1;
  char *pcVar2;
  int iVar3;
  bool bVar4;
  char **ppcStack_140;
  char quote;
  char *ptr;
  char name [255];
  int bufsize_local;
  char *buf_local;
  char *n_local;
  char *p_local;
  Fl_Help_View *this_local;
  
  *buf = '\0';
  unique0x1000018c = bufsize;
  n_local = p;
  while( true ) {
    bVar4 = false;
    if (*n_local != '\0') {
      bVar4 = *n_local != '>';
    }
    if (!bVar4) {
      return (char *)0x0;
    }
    while (iVar3 = isspace((uint)(byte)*n_local), iVar3 != 0) {
      n_local = n_local + 1;
    }
    if ((*n_local == '>') || (*n_local == '\0')) break;
    ppcStack_140 = &ptr;
    while( true ) {
      bVar4 = false;
      if (*n_local != '\0') {
        iVar3 = isspace((uint)(byte)*n_local);
        bVar4 = false;
        if ((iVar3 == 0) && (bVar4 = false, *n_local != '=')) {
          bVar4 = *n_local != '>';
        }
      }
      if (!bVar4) break;
      if (ppcStack_140 < name + 0xf6) {
        *(char *)ppcStack_140 = *n_local;
        ppcStack_140 = (char **)((long)ppcStack_140 + 1);
      }
      n_local = n_local + 1;
    }
    *(undefined1 *)ppcStack_140 = 0;
    iVar3 = isspace((uint)(byte)*n_local);
    if (((iVar3 == 0) && (*n_local != '\0')) && (*n_local != '>')) {
      ppcStack_140 = (char **)buf;
      if (*n_local == '=') {
        n_local = n_local + 1;
      }
      while( true ) {
        bVar4 = false;
        if (*n_local != '\0') {
          iVar3 = isspace((uint)(byte)*n_local);
          bVar4 = false;
          if (iVar3 == 0) {
            bVar4 = *n_local != '>';
          }
        }
        if (!bVar4) break;
        if ((*n_local == '\'') || (*n_local == '\"')) {
          cVar1 = *n_local;
          pcVar2 = n_local;
          while( true ) {
            n_local = pcVar2 + 1;
            bVar4 = false;
            if (*n_local != '\0') {
              bVar4 = *n_local != cVar1;
            }
            if (!bVar4) break;
            pcVar2 = n_local;
            if ((long)((long)ppcStack_140 + (1 - (long)buf)) < (long)stack0xffffffffffffffcc) {
              *(char *)ppcStack_140 = *n_local;
              ppcStack_140 = (char **)((long)ppcStack_140 + 1);
            }
          }
          if (*n_local == cVar1) {
            n_local = pcVar2 + 2;
          }
        }
        else {
          if ((long)((long)ppcStack_140 + (1 - (long)buf)) < (long)stack0xffffffffffffffcc) {
            *(char *)ppcStack_140 = *n_local;
            ppcStack_140 = (char **)((long)ppcStack_140 + 1);
          }
          n_local = n_local + 1;
        }
      }
      *(char *)ppcStack_140 = '\0';
    }
    else {
      *buf = '\0';
    }
    iVar3 = strcasecmp(n,(char *)&ptr);
    if (iVar3 == 0) {
      return buf;
    }
    *buf = '\0';
    if (*n_local == '>') {
      return (char *)0x0;
    }
  }
  return (char *)0x0;
}

Assistant:

const char *					// O - Pointer to buf or NULL
Fl_Help_View::get_attr(const char *p,		// I - Pointer to start of attributes
                      const char *n,		// I - Name of attribute
		      char       *buf,		// O - Buffer for attribute value
		      int        bufsize)	// I - Size of buffer
{
  char	name[255],				// Name from string
	*ptr,					// Pointer into name or value
	quote;					// Quote


  buf[0] = '\0';

  while (*p && *p != '>')
  {
    while (isspace((*p)&255))
      p ++;

    if (*p == '>' || !*p)
      return (NULL);

    for (ptr = name; *p && !isspace((*p)&255) && *p != '=' && *p != '>';)
      if (ptr < (name + sizeof(name) - 1))
        *ptr++ = *p++;
      else
        p ++;

    *ptr = '\0';

    if (isspace((*p)&255) || !*p || *p == '>')
      buf[0] = '\0';
    else
    {
      if (*p == '=')
        p ++;

      for (ptr = buf; *p && !isspace((*p)&255) && *p != '>';)
        if (*p == '\'' || *p == '\"')
	{
	  quote = *p++;

	  while (*p && *p != quote)
	    if ((ptr - buf + 1) < bufsize)
	      *ptr++ = *p++;
	    else
	      p ++;

          if (*p == quote)
	    p ++;
	}
	else if ((ptr - buf + 1) < bufsize)
	  *ptr++ = *p++;
	else
	  p ++;

      *ptr = '\0';
    }

    if (strcasecmp(n, name) == 0)
      return (buf);
    else
      buf[0] = '\0';

    if (*p == '>')
      return (NULL);
  }

  return (NULL);
}